

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

bool __thiscall
(anonymous_namespace)::$_0::operator()
          (anon_class_1_0_00000001_for__M_comp *this,InterfaceHandle *hnd,
          unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
          *testEndpoint)

{
  bool bVar1;
  InterfaceHandle id;
  pointer pEVar2;
  InterfaceHandle *in_RSI;
  
  pEVar2 = std::unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>::
           operator->((unique_ptr<helics::EndpointObject,_std::default_delete<helics::EndpointObject>_>
                       *)0x1e15c6);
  id = helics::Interface::getHandle(&pEVar2->endPtr->super_Interface);
  bVar1 = helics::InterfaceHandle::operator<(in_RSI,id);
  return bVar1;
}

Assistant:

inline HelicsEndpoint addEndpoint(HelicsFederate fed, std::unique_ptr<helics::EndpointObject> ept)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    ept->valid = EndpointValidationIdentifier;
    ept->fed = fedObj;
    HelicsEndpoint hept = ept.get();

    if (fedObj->epts.empty() || ept->endPtr->getHandle() > fedObj->epts.back()->endPtr->getHandle()) {
        fedObj->epts.push_back(std::move(ept));
    } else {
        auto ind = std::upper_bound(fedObj->epts.begin(), fedObj->epts.end(), ept->endPtr->getHandle(), endpointSearch);
        fedObj->epts.insert(ind, std::move(ept));
    }
    return hept;
}